

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O3

void __thiscall QStackedLayout::addItem(QStackedLayout *this,QLayoutItem *item)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*item->_vptr_QLayoutItem[0xd])(item);
  if ((QWidget *)CONCAT44(extraout_var,iVar1) == (QWidget *)0x0) {
    addItem();
  }
  else {
    insertWidget(this,*(int *)(*(long *)&(this->super_QLayout).field_0x8 + 0xc0),
                 (QWidget *)CONCAT44(extraout_var,iVar1));
  }
  (*item->_vptr_QLayoutItem[1])(item);
  return;
}

Assistant:

void QStackedLayout::addItem(QLayoutItem *item)
{
    std::unique_ptr<QLayoutItem> guard(item);
    QWidget *widget = item->widget();
    if (Q_UNLIKELY(!widget)) {
        qWarning("QStackedLayout::addItem: Only widgets can be added");
        return;
    }
    addWidget(widget);
}